

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall TesterThread::AllocateObject(TesterThread *this)

{
  undefined1 local_20 [8];
  Object object;
  TesterThread *this_local;
  
  object._8_8_ = this;
  object.ptr._0_4_ = TestHarness::Skewed(&(this->rnd_).super_TestHarness,0x10);
  local_20 = (undefined1  [8])AllocatorState::alloc(&this->rnd_,(long)(int)object.ptr);
  if (local_20 == (undefined1  [8])0x0) {
    syscall(1,2,"Check failed: object.ptr\n",0x19);
    abort();
  }
  object.ptr._4_4_ = 0;
  FillContents(this,(Object *)local_20);
  std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::push_back
            (&this->heap_,(value_type *)local_20);
  this->heap_size_ = (long)(int)object.ptr + this->heap_size_;
  return;
}

Assistant:

void AllocateObject() {
    Object object;
    object.size = rnd_.Skewed(FLAGS_lgmaxsize);
    object.ptr = static_cast<char*>(rnd_.alloc(object.size));
    CHECK(object.ptr);
    object.generation = 0;
    FillContents(&object);
    heap_.push_back(object);
    heap_size_ += object.size;
  }